

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_TestShell::createTest
          (TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_TestShell *this)

{
  TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x79);
  TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_Test::
  TEST_DoublingFactorCounterTest_Not_NoPointsHand_Open_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_NoPointsHand_Open)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::NoPointsHand));
}